

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_leader.cpp
# Opt level: O3

bool __thiscall ON_Leader::Transform(ON_Leader *this,ON_Xform *xform)

{
  ON_Plane *this_00;
  ON_NurbsCurve *pOVar1;
  ON_2dPoint *pOVar2;
  ON_3dPoint p;
  bool bVar3;
  int iVar4;
  ON_3dPoint *pOVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ON_3dPointArray pts;
  ON_SimpleArray<ON_3dPoint> local_60;
  ON_3dPoint local_48;
  
  bVar3 = ON_Geometry::Transform((ON_Geometry *)this,xform);
  if (bVar3) {
    bVar3 = ON_Xform::IsTranslation(xform,0.0);
    if (bVar3) {
      bVar3 = ON_Plane::Transform(&(this->super_ON_Annotation).m_plane,xform);
    }
    else {
      iVar4 = (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count;
      lVar8 = (long)iVar4;
      ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_60,iVar4 + 1);
      if (0 < lVar8) {
        lVar6 = 8;
        lVar7 = 0;
        do {
          pOVar2 = (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_a;
          ON_Plane::PointAt(&local_48,&(this->super_ON_Annotation).m_plane,
                            *(double *)((long)pOVar2 + lVar6 + -8),
                            *(double *)((long)&pOVar2->x + lVar6));
          pOVar5 = ON_SimpleArray<ON_3dPoint>::AppendNew(&local_60);
          pOVar5->z = local_48.z;
          pOVar5->x = local_48.x;
          pOVar5->y = local_48.y;
          ON_3dPoint::Transform((ON_3dPoint *)((long)&(local_60.m_a)->x + lVar7),xform);
          lVar7 = lVar7 + 0x18;
          lVar6 = lVar6 + 0x10;
        } while (lVar8 * 0x18 != lVar7);
      }
      ON_2dPoint::operator=(&this->m_text_point,&ON_3dPoint::UnsetPoint);
      this_00 = &(this->super_ON_Annotation).m_plane;
      bVar3 = ON_Plane::Transform(this_00,xform);
      if (0 < iVar4) {
        lVar6 = 8;
        lVar7 = 0;
        do {
          pOVar2 = (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_a;
          p.z = *(double *)((long)&(local_60.m_a)->z + lVar7);
          p._0_16_ = *(undefined1 (*) [16])((long)&(local_60.m_a)->x + lVar7);
          ON_Plane::ClosestPointTo
                    (this_00,p,(double *)((long)pOVar2 + lVar6 + -8),
                     (double *)((long)&pOVar2->x + lVar6));
          lVar6 = lVar6 + 0x10;
          lVar7 = lVar7 + 0x18;
        } while (lVar8 * 0x18 != lVar7);
      }
      ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_60);
    }
    if (bVar3) {
      pOVar1 = this->m_curve;
      if (pOVar1 == (ON_NurbsCurve *)0x0) {
        return true;
      }
      iVar4 = (*(pOVar1->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x1c])
                        (pOVar1,xform);
      if ((char)iVar4 != '\0') {
        return true;
      }
      if (this->m_curve != (ON_NurbsCurve *)0x0) {
        (*(this->m_curve->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
      }
      this->m_curve = (ON_NurbsCurve *)0x0;
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Leader::Transform(const ON_Xform& xform)
{
  bool rc = ON_Geometry::Transform(xform);
  if (rc)
  {
    if (xform.IsTranslation())
      rc = m_plane.Transform(xform);
    else
    {
      int cnt = m_points.Count();
      ON_3dPointArray pts(cnt+1);
      for (int i = 0; i < cnt; i++)
      {
        pts.AppendNew() = m_plane.PointAt(m_points[i].x, m_points[i].y);
        pts[i].Transform(xform);
      }
      m_text_point = ON_3dPoint::UnsetPoint;
      rc = m_plane.Transform(xform);
      for (int i = 0; i < cnt; i++)
        m_plane.ClosestPointTo(pts[i], &m_points[i].x, &m_points[i].y);
    }
  }
  if (rc && nullptr != m_curve && !m_curve->Transform(xform))
  {
    delete m_curve;
    m_curve = nullptr;
  }
  return rc;
}